

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

int check_for_multi(vocoldef *dolist)

{
  int iVar1;
  vocoldef *in_RDI;
  int result;
  int i;
  int dolen;
  uint local_14;
  int local_10;
  
  local_14 = 0;
  iVar1 = voclistlen(in_RDI);
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    local_14 = in_RDI[local_10].vocolflg & 0x89U | local_14;
  }
  return local_14;
}

Assistant:

static int check_for_multi(vocoldef *dolist)
{
    int dolen;
    int i;
    int result;

    /* presume we won't find any flags */
    result = 0;

    /* 
     *   scan the list for ALL, ANY, or THEM flags, combining any such
     *   flags we find into the result 
     */
    dolen = voclistlen(dolist);
    for (i = 0 ; i < dolen ; ++i)
        result |= (dolist[i].vocolflg & (VOCS_ALL | VOCS_ANY | VOCS_THEM));

    /* return the result */
    return result;
}